

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               ASTContext *parentContext,SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  NetType *netType;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  ASTContext *context_00;
  long lVar2;
  ulong uVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params;
  string_view moduleName;
  ASTContext context;
  undefined1 local_128 [144];
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  not_null<const_slang::ast::Scope_*> local_68;
  
  ASTContext::resetFlags
            ((ASTContext *)&stack0xffffffffffffff98,parentContext,
             (bitmask<slang::ast::ASTFlags>)0x20);
  params = createUninstantiatedParams
                     ((ast *)syntax->parameters,
                      (HierarchyInstantiationSyntax *)&stack0xffffffffffffff98,context_00);
  moduleName = parsing::Token::valueText(&syntax->type);
  local_128._128_8_ = local_128;
  local_98.groups_size_index = 0x3f;
  local_98.groups_size_mask = 1;
  local_98.elements_ = (value_type_pointer)0x0;
  local_98.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_78 = 0;
  uStack_70 = 0;
  local_128._136_8_ = local_128._128_8_;
  netType = Scope::getDefaultNetType(local_68.ptr);
  uVar3 = (syntax->instances).elements._M_extent._M_extent_value + 1;
  if (1 < uVar3) {
    uVar3 = uVar3 >> 1;
    lVar2 = 0;
    do {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->instances).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar2));
      createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
                (compilation,syntax,(HierarchicalInstanceSyntax *)*ppSVar1,moduleName,
                 (ASTContext *)&stack0xffffffffffffff98,params,results,implicitNets,
                 (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                  *)local_128,netType);
      lVar2 = lVar2 + 0x30;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_((allocator_type)local_128._136_8_,&local_98);
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(Compilation& compilation,
                                         const HierarchyInstantiationSyntax& syntax,
                                         const ASTContext& parentContext,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto params = createUninstantiatedParams(syntax, context);

    createUninstantiatedDefs(compilation, syntax, syntax.type.valueText(), context, params, results,
                             implicitNets);
}